

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<YeeGridTest2d_GetOrigin_Test>::CreateTest
          (TestFactoryImpl<YeeGridTest2d_GetOrigin_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x40);
  YeeGridTest2d_GetOrigin_Test::YeeGridTest2d_GetOrigin_Test
            ((YeeGridTest2d_GetOrigin_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }